

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_Browse(UA_Server *server,UA_Session *session,UA_BrowseRequest *request,
                   UA_BrowseResponse *response)

{
  size_t size_00;
  UA_Boolean UVar1;
  UA_BrowseResult *pUVar2;
  uint local_78;
  uint local_70;
  uint local_6c;
  ulong local_60;
  size_t i;
  size_t size;
  UA_BrowseResponse *response_local;
  UA_BrowseRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_70 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_6c = 0;
    }
    else {
      local_6c = session->channel->connection->sockfd;
    }
    local_70 = local_6c;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing BrowseRequest"
               ,(ulong)local_70,(ulong)local_78,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  UVar1 = UA_NodeId_isNull(&(request->view).viewId);
  if (UVar1) {
    if (request->nodesToBrowseSize == 0) {
      (response->responseHeader).serviceResult = 0x800f0000;
    }
    else {
      size_00 = request->nodesToBrowseSize;
      pUVar2 = (UA_BrowseResult *)UA_Array_new(size_00,UA_TYPES + 0x98);
      response->results = pUVar2;
      if (response->results == (UA_BrowseResult *)0x0) {
        (response->responseHeader).serviceResult = 0x80030000;
      }
      else {
        response->resultsSize = size_00;
        for (local_60 = 0; local_60 < size_00; local_60 = local_60 + 1) {
          Service_Browse_single
                    (server,session,(ContinuationPointEntry *)0x0,request->nodesToBrowse + local_60,
                     request->requestedMaxReferencesPerNode,response->results + local_60);
        }
      }
    }
  }
  else {
    (response->responseHeader).serviceResult = 0x806b0000;
  }
  return;
}

Assistant:

void Service_Browse(UA_Server *server, UA_Session *session, const UA_BrowseRequest *request,
                    UA_BrowseResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing BrowseRequest");
    if(!UA_NodeId_isNull(&request->view.viewId)) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADVIEWIDUNKNOWN;
        return;
    }

    if(request->nodesToBrowseSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    size_t size = request->nodesToBrowseSize;
    response->results = UA_Array_new(size, &UA_TYPES[UA_TYPES_BROWSERESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = size;

#ifdef UA_ENABLE_EXTERNAL_NAMESPACES
#ifdef NO_ALLOCA
    UA_Boolean isExternal[size];
    UA_UInt32 indices[size];
#else
    UA_Boolean *isExternal = UA_alloca(sizeof(UA_Boolean) * size);
    UA_UInt32 *indices = UA_alloca(sizeof(UA_UInt32) * size);
#endif /*NO_ALLOCA */
    memset(isExternal, false, sizeof(UA_Boolean) * size);
    for(size_t j = 0; j < server->externalNamespacesSize; ++j) {
        size_t indexSize = 0;
        for(size_t i = 0; i < size; ++i) {
            if(request->nodesToBrowse[i].nodeId.namespaceIndex != server->externalNamespaces[j].index)
                continue;
            isExternal[i] = true;
            indices[indexSize] = (UA_UInt32)i;
            ++indexSize;
        }
        if(indexSize == 0)
            continue;
        UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
        ens->browseNodes(ens->ensHandle, &request->requestHeader, request->nodesToBrowse, indices,
                         (UA_UInt32)indexSize, request->requestedMaxReferencesPerNode,
                         response->results, response->diagnosticInfos);
    }
#endif

    for(size_t i = 0; i < size; ++i) {
#ifdef UA_ENABLE_EXTERNAL_NAMESPACES
        if(!isExternal[i])
#endif
            Service_Browse_single(server, session, NULL, &request->nodesToBrowse[i],
                                  request->requestedMaxReferencesPerNode, &response->results[i]);
    }
}